

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

size_t int_tcfg_list(size_t maxItems,TRUN_ConfigItem *outArray)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  
  if (outArray == (TRUN_ConfigItem *)0x0) {
    sVar6 = 1;
  }
  else {
    sVar6 = (size_t)(maxItems != 0);
    for (lVar7 = 0; sVar6 * 0x30 - lVar7 != 0; lVar7 = lVar7 + 0x30) {
      uVar1 = *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7);
      uVar2 = *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7 + 8);
      uVar3 = *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7 + 0x10);
      uVar4 = *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7 + 0x18);
      uVar5 = *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7 + 0x28);
      *(undefined8 *)(outArray->name + lVar7 + 0x1f) =
           *(undefined8 *)(get_config_items(unsigned_long*)::glb_Config + lVar7 + 0x20);
      *(undefined8 *)(outArray->name + lVar7 + 0x1f + 8) = uVar5;
      *(undefined8 *)(outArray->name + lVar7 + 0xf) = uVar3;
      *(undefined8 *)(outArray->name + lVar7 + 0xf + 8) = uVar4;
      *(undefined8 *)(outArray->name + lVar7 + -1) = uVar1;
      *(undefined8 *)(outArray->name + lVar7 + -1 + 8) = uVar2;
    }
  }
  return sVar6;
}

Assistant:

static size_t int_tcfg_list(size_t maxItems, TRUN_ConfigItem *outArray) {
    // Return number of items available

    size_t nGlbItems = 0;
    auto glb_config = get_config_items(&nGlbItems);

    if (outArray == nullptr) {
        return nGlbItems;
    }

    size_t nToCopy = (maxItems<nGlbItems)?maxItems:nGlbItems;
    for(size_t i=0;i<nToCopy;i++) {
        outArray[i] = glb_config[i];
    }
    return nToCopy;
}